

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

bool __thiscall Minisat::IntOption::parse(IntOption *this,char *str)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  char *__format;
  char *span;
  char *end;
  
  span = str;
  bVar2 = match<char_const*>(&span,"-");
  if (((bVar2) && (bVar2 = match<char_const*>(&span,(this->super_Option).name), bVar2)) &&
     (bVar2 = match<char_const*>(&span,"="), pcVar1 = span, bVar2)) {
    lVar3 = strtol(span,&end,10);
    bVar2 = end != (char *)0x0;
    if (!bVar2) {
      return bVar2;
    }
    iVar4 = (int)lVar3;
    if ((this->range).end < iVar4) {
      pcVar5 = (this->super_Option).name;
      __format = "ERROR! value <%s> is too large for option \"%s\".\n";
    }
    else {
      if ((this->range).begin <= iVar4) {
        this->value = iVar4;
        return bVar2;
      }
      pcVar5 = (this->super_Option).name;
      __format = "ERROR! value <%s> is too small for option \"%s\".\n";
    }
    fprintf(_stderr,__format,pcVar1,pcVar5);
    exit(1);
  }
  return false;
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 

        if (!match(span, "-") || !match(span, name) || !match(span, "="))
            return false;

        char*   end;
        int32_t tmp = strtol(span, &end, 10);

        if (end == NULL) 
            return false;
        else if (tmp > range.end){
            fprintf(stderr, "ERROR! value <%s> is too large for option \"%s\".\n", span, name);
            exit(1);
        }else if (tmp < range.begin){
            fprintf(stderr, "ERROR! value <%s> is too small for option \"%s\".\n", span, name);
            exit(1); }

        value = tmp;

        return true;
    }